

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool ifhunyise(int tongse_num,int zipai_num)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pbVar5;
  pointer pbVar6;
  mapped_type *pmVar7;
  int iVar8;
  __node_base _Var9;
  char cVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  char cVar14;
  int i;
  string local_50;
  
  iVar8 = 0;
  iVar11 = 0;
  iVar12 = 0;
  if (my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    iVar12 = 0;
    iVar11 = 0;
    iVar8 = 0;
    _Var9._M_nxt = my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt;
    do {
      p_Var1 = _Var9._M_nxt + 1;
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
      cVar14 = *(char *)&p_Var1->_M_nxt->_M_nxt;
      iVar8 = iVar8 + (uint)(cVar14 == 'W');
      iVar11 = iVar11 + (uint)(cVar14 == 'B');
      iVar12 = iVar12 + (uint)(cVar14 == 'T');
    } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
  }
  iVar3 = 0;
  if (-1 < iVar12) {
    iVar3 = iVar12;
  }
  cVar14 = 'n';
  if (-1 < iVar12) {
    cVar14 = 'T';
  }
  iVar12 = iVar3;
  if (iVar3 < iVar11) {
    iVar12 = iVar11;
  }
  cVar10 = 'B';
  if (iVar11 < iVar3) {
    cVar10 = cVar14;
  }
  pbVar6 = peng_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar14 = 'W';
  if (iVar8 < iVar12) {
    cVar14 = cVar10;
  }
  for (; pbVar5 = chi_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pbVar6 != peng_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    if (*(pbVar6->_M_dataplus)._M_p != cVar14) goto LAB_00118544;
  }
  for (; pbVar6 = gang_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pbVar5 != chi_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    if (*(pbVar5->_M_dataplus)._M_p != cVar14) goto LAB_00118544;
  }
  for (; pbVar6 != gang_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    if (*(pbVar6->_M_dataplus)._M_p != cVar14) goto LAB_00118544;
  }
  bVar2 = false;
  iVar8 = 1;
  do {
    makeCardName_abi_cxx11_(&local_50,'J',iVar8);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&my_active_card_abi_cxx11_,&local_50);
    iVar11 = *pmVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (zipai_num <= iVar11) {
      bVar2 = true;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 4);
  iVar8 = 1;
  do {
    makeCardName_abi_cxx11_(&local_50,'F',iVar8);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&my_active_card_abi_cxx11_,&local_50);
    iVar11 = *pmVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (zipai_num <= iVar11) {
      bVar2 = true;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 5);
  uVar4 = 0;
  if (bVar2) {
    pbVar6 = peng_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      uVar4 = 0;
      _Var9._M_nxt = my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt;
      do {
        if (*(char *)&(_Var9._M_nxt[1]._M_nxt)->_M_nxt == cVar14) {
          uVar4 = uVar4 + *(int *)&_Var9._M_nxt[5]._M_nxt;
        }
        _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
      } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
    }
    for (; pbVar5 = chi_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        pbVar6 != peng_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      uVar13 = uVar4 + 3;
      if (*(pbVar6->_M_dataplus)._M_p != cVar14) {
        uVar13 = uVar4;
      }
      uVar4 = uVar13;
    }
    for (; pbVar6 = gang_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        pbVar5 != chi_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      uVar13 = uVar4 + 3;
      if (*(pbVar5->_M_dataplus)._M_p != cVar14) {
        uVar13 = uVar4;
      }
      uVar4 = uVar13;
    }
    for (; pbVar6 != gang_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      uVar13 = uVar4 + 3;
      if (*(pbVar6->_M_dataplus)._M_p != cVar14) {
        uVar13 = uVar4;
      }
      uVar4 = uVar13;
    }
    uVar4 = (uint)(tongse_num <= (int)uVar4);
  }
LAB_001186cc:
  return SUB41(uVar4,0);
LAB_00118544:
  uVar4 = 0;
  goto LAB_001186cc;
}

Assistant:

bool ifhunyise( int tongse_num, int zipai_num) {
	int tiao = 0, bin = 0, wan = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == 'W') wan++;
		if (it->first[0] == 'B') bin++;
		if (it->first[0] == 'T') tiao++;
	}
	char max = 'n';
	int maxnum = 0;
	if (tiao >= maxnum) {
		max = 'T';
		maxnum = tiao;
	}
	if (bin >= maxnum) {
		max = 'B';
		maxnum = bin;
	}
	if (wan >= maxnum) {
		max = 'W';
		maxnum = wan;
	}
	//return max;
	char huase = max;
	for (auto it = peng.begin(); it != peng.end(); it++) {
		if ((*it)[0] != huase) return false;
	}
	for (auto it = chi.begin(); it != chi.end(); it++) {
		if ((*it)[0] != huase) return false;
	}
	for (auto it = gang.begin(); it != gang.end(); it++) {
		if ((*it)[0] != huase) return false;
	}

	int flag = 0;
	for (int i = 1; i <= 3; i++) {
		if (my_active_card[makeCardName('J', i)] >= zipai_num) flag = 1;
	}
	for (int i = 1; i <= 4; i++) {
		if (my_active_card[makeCardName('F', i)] >= zipai_num) flag = 1;
	}
	if (flag == 0) return false;

	int counter = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == huase) {
			counter += it->second;
		}
	}

	for (auto it = peng.begin(); it != peng.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}
	for (auto it = chi.begin(); it != chi.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}
	for (auto it = gang.begin(); it != gang.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}

	if (counter >= tongse_num) return true;
	return false;
}